

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O3

void __thiscall
spvtools::opt::InstructionBuilder::InstructionBuilder
          (InstructionBuilder *this,IRContext *context,Instruction *insert_before,
          Analysis preserved_analyses)

{
  BasicBlock *pBVar1;
  
  pBVar1 = IRContext::get_instr_block(context,insert_before);
  this->context_ = context;
  this->parent_ = pBVar1;
  (this->insert_before_).super_iterator.node_ = insert_before;
  this->preserved_analyses_ = preserved_analyses;
  if (preserved_analyses < kAnalysisDecorations) {
    return;
  }
  __assert_fail("!(preserved_analyses_ & ~(IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ir_builder.h"
                ,0x27e,
                "spvtools::opt::InstructionBuilder::InstructionBuilder(IRContext *, BasicBlock *, InsertionPointTy, IRContext::Analysis)"
               );
}

Assistant:

InstructionBuilder(
      IRContext* context, Instruction* insert_before,
      IRContext::Analysis preserved_analyses = IRContext::kAnalysisNone)
      : InstructionBuilder(context, context->get_instr_block(insert_before),
                           InsertionPointTy(insert_before),
                           preserved_analyses) {}